

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v9::detail::
for_each_codepoint<fmt::v9::detail::compute_width(fmt::v9::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  detail *pdVar1;
  byte bVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  detail *pdVar11;
  detail *pdVar12;
  byte *pbVar13;
  type size;
  size_t __n;
  byte *pbVar14;
  string_view sVar15;
  string_view sVar16;
  anon_class_8_1_54a39806 decode;
  char buf [7];
  count_code_points local_50;
  byte local_48 [8];
  char *local_40;
  detail *local_38;
  
  local_50.count = (size_t *)s.size_;
  pcVar8 = s.data_;
  pdVar12 = this;
  if ((char *)0x3 < pcVar8) {
    pdVar1 = this + (long)pcVar8;
    local_40 = pcVar8;
    local_38 = this;
    do {
      pdVar11 = pdVar12;
      this = pdVar11;
      if (pdVar1 + -3 <= pdVar11) break;
      uVar7 = (uint)((byte)*pdVar11 >> 3);
      lVar6 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar7];
      uVar9 = ((byte)pdVar11[3] & 0x3f |
              ((byte)pdVar11[2] & 0x3f) << 6 |
              ((byte)pdVar11[1] & 0x3f) << 0xc |
              ((uint)(byte)*pdVar11 & *(uint *)(&DAT_0019cf80 + lVar6 * 4)) << 0x12) >>
              ((&DAT_0019cfc0)[lVar6 * 4] & 0x1f);
      uVar10 = (((byte)pdVar11[1] >> 2 & 0xfffffff0) + (uint)((byte)pdVar11[2] >> 6) * 4 |
                (uint)((byte)pdVar11[3] >> 6) |
                (uint)(uVar9 < *(uint *)(&DAT_0019cfa0 + lVar6 * 4)) << 6 |
                (uint)(0x10ffff < uVar9) << 8 | (uint)((uVar9 & 0x7ffff800) == 0xd800) << 7) ^ 0x2a;
      if (uVar10 >> ((&DAT_0019cfe0)[lVar6 * 4] & 0x1f) == 0) {
        uVar5 = (ulong)((0x80ff0000U >> uVar7 & 1) != 0);
        pdVar12 = pdVar11 + lVar6 + uVar5;
        sVar4 = uVar5 + lVar6;
      }
      else {
        pdVar12 = pdVar11 + 1;
        sVar4 = 1;
      }
      sVar15.size_ = sVar4;
      sVar15.data_ = (char *)pdVar11;
      bVar3 = anon_func::count_code_points::operator()
                        (&local_50,
                         -(uint)(uVar10 >> ((&DAT_0019cfe0)[lVar6 * 4] & 0x1f) != 0) | uVar9,sVar15)
      ;
      if (!bVar3) {
        pdVar12 = (detail *)0x0;
      }
      this = (detail *)0x0;
    } while (pdVar12 != (detail *)0x0);
    pcVar8 = local_40;
    pdVar12 = local_38;
    if (pdVar11 < pdVar1 + -3) {
      return;
    }
  }
  __n = (long)(pdVar12 + (long)pcVar8) - (long)this;
  if (__n != 0) {
    local_48[4] = 0;
    local_48[5] = 0;
    local_48[6] = 0;
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    memcpy(local_48,this,__n);
    pbVar13 = local_48;
    do {
      uVar7 = (uint)(*pbVar13 >> 3);
      lVar6 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar7];
      uVar5 = (ulong)((0x80ff0000U >> uVar7 & 1) != 0);
      uVar7 = (pbVar13[3] & 0x3f |
              (pbVar13[2] & 0x3f) << 6 |
              (pbVar13[1] & 0x3f) << 0xc |
              ((uint)*pbVar13 & *(uint *)(&DAT_0019cf80 + lVar6 * 4)) << 0x12) >>
              ((&DAT_0019cfc0)[lVar6 * 4] & 0x1f);
      uVar9 = ((pbVar13[1] >> 2 & 0xfffffff0) + (uint)(pbVar13[2] >> 6) * 4 |
               (uint)(pbVar13[3] >> 6) | (uint)(uVar7 < *(uint *)(&DAT_0019cfa0 + lVar6 * 4)) << 6 |
               (uint)(0x10ffff < uVar7) << 8 | (uint)((uVar7 & 0x7ffff800) == 0xd800) << 7) ^ 0x2a;
      bVar2 = (&DAT_0019cfe0)[lVar6 * 4] & 0x1f;
      if (uVar9 >> bVar2 == 0) {
        sVar4 = uVar5 + lVar6;
      }
      else {
        sVar4 = 1;
      }
      sVar16.size_ = sVar4;
      sVar16.data_ = (char *)this;
      bVar3 = anon_func::count_code_points::operator()
                        (&local_50,-(uint)(uVar9 >> bVar2 != 0) | uVar7,sVar16);
      if (!bVar3) {
        return;
      }
      if (uVar9 >> bVar2 == 0) {
        pbVar14 = pbVar13 + lVar6 + uVar5;
      }
      else {
        pbVar14 = pbVar13 + 1;
      }
      this = this + ((long)pbVar14 - (long)pbVar13);
      pbVar13 = pbVar14;
    } while ((long)pbVar14 - (long)local_48 < (long)__n);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, error ? 1 : to_unsigned(end - buf_ptr)));
    return result ? (error ? buf_ptr + 1 : end) : nullptr;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    const char* buf_ptr = buf;
    do {
      auto end = decode(buf_ptr, p);
      if (!end) return;
      p += end - buf_ptr;
      buf_ptr = end;
    } while (buf_ptr - buf < num_chars_left);
  }
}